

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O1

Normalizer2 * icu_63::Normalizer2Factory::getInstance(UNormalizationMode mode,UErrorCode *errorCode)

{
  Normalizer2 *pNVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    switch(mode) {
    case UNORM_NFD:
      pNVar1 = Normalizer2::getNFDInstance(errorCode);
      return pNVar1;
    case UNORM_NFKD:
      umtx_initOnce<char_const*>((UInitOnce *)&nfkcInitOnce,initSingletons,"nfkc",errorCode);
      pNVar1 = (Normalizer2 *)(nfkcSingleton + 0x20);
      break;
    case UNORM_DEFAULT:
      pNVar1 = Normalizer2::getNFCInstance(errorCode);
      return pNVar1;
    case UNORM_NFKC:
      umtx_initOnce<char_const*>((UInitOnce *)&nfkcInitOnce,initSingletons,"nfkc",errorCode);
      pNVar1 = (Normalizer2 *)(nfkcSingleton + 8);
      break;
    case UNORM_FCD:
      pNVar1 = getFCDInstance(errorCode);
      return pNVar1;
    default:
      pNVar1 = getNoopInstance(errorCode);
      return pNVar1;
    }
    if (nfkcSingleton == 0) {
      pNVar1 = (Normalizer2 *)0x0;
    }
  }
  else {
    pNVar1 = (Normalizer2 *)0x0;
  }
  return pNVar1;
}

Assistant:

const Normalizer2 *
Normalizer2Factory::getInstance(UNormalizationMode mode, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    switch(mode) {
    case UNORM_NFD:
        return Normalizer2::getNFDInstance(errorCode);
    case UNORM_NFKD:
        return Normalizer2::getNFKDInstance(errorCode);
    case UNORM_NFC:
        return Normalizer2::getNFCInstance(errorCode);
    case UNORM_NFKC:
        return Normalizer2::getNFKCInstance(errorCode);
    case UNORM_FCD:
        return getFCDInstance(errorCode);
    default:  // UNORM_NONE
        return getNoopInstance(errorCode);
    }
}